

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagExpressionParser::acceptChar(TagExpressionParser *this,char c)

{
  char c_local;
  TagExpressionParser *this_local;
  
  if (c == ',') {
    std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::push_back
              (&this->m_exp->m_tagSets,&this->m_currentTagSet);
  }
  else if (c == '~') {
    this->m_isNegated = true;
  }
  return;
}

Assistant:

virtual void acceptChar( char c ) {
            switch( c ) {
                case '~':
                    m_isNegated = true;
                    break;
                case ',':
                    m_exp.m_tagSets.push_back( m_currentTagSet );
                    break;
            }
        }